

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMateGeneric::InjectConstraints
          (ChLinkMateGeneric *this,ChSystemDescriptor *mdescriptor)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = (*(this->super_ChLinkMate).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.
            _vptr_ChObj[9])();
  if ((char)iVar1 != '\0') {
    iVar1 = (this->mask).nconstr;
    if (0 < iVar1) {
      lVar3 = 0;
      do {
        lVar2 = (long)iVar1;
        if (lVar2 <= lVar3) {
          __assert_fail("(i >= 0) && (i < nconstr)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                        ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
        }
        if (((this->mask).constraints.
             super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar3]->super_ChConstraintTwo).
            super_ChConstraint.active == true) {
          (*mdescriptor->_vptr_ChSystemDescriptor[3])(mdescriptor);
          iVar1 = (this->mask).nconstr;
          lVar2 = (long)iVar1;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < lVar2);
    }
  }
  return;
}

Assistant:

void ChLinkMateGeneric::InjectConstraints(ChSystemDescriptor& mdescriptor) {
    if (!this->IsActive())
        return;

    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive())
            mdescriptor.InsertConstraint(&mask.Constr_N(i));
    }
}